

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_compressWeights(void *dst,size_t dstSize,void *weightTable,size_t wtSize,void *workspace,
                          size_t workspaceSize)

{
  uint uVar1;
  void *pvVar2;
  size_t cSize;
  size_t _var_err___1;
  size_t hSize;
  size_t _var_err__;
  uint maxCount;
  HUF_CompressWeightsWksp *wksp;
  U32 tableLog;
  uint maxSymbolValue;
  BYTE *oend;
  BYTE *op;
  BYTE *ostart;
  size_t workspaceSize_local;
  void *workspace_local;
  size_t wtSize_local;
  void *weightTable_local;
  size_t dstSize_local;
  void *dst_local;
  
  _tableLog = (long)dst + dstSize;
  wksp._4_4_ = 0xc;
  wksp._0_4_ = 6;
  if (workspaceSize < 0x1b4) {
    dst_local = (void *)0xffffffffffffffff;
  }
  else if (wtSize < 2) {
    dst_local = (void *)0x0;
  }
  else {
    oend = (BYTE *)dst;
    op = (BYTE *)dst;
    ostart = (BYTE *)workspaceSize;
    workspaceSize_local = (size_t)workspace;
    workspace_local = (void *)wtSize;
    wtSize_local = (size_t)weightTable;
    weightTable_local = (void *)dstSize;
    dstSize_local = (size_t)dst;
    uVar1 = HIST_count_simple((uint *)((long)workspace + 0x164),(uint *)((long)&wksp + 4),
                              weightTable,wtSize);
    if ((void *)(ulong)uVar1 == workspace_local) {
      dst_local = (void *)0x1;
    }
    else if (uVar1 == 1) {
      dst_local = (void *)0x0;
    }
    else {
      wksp._0_4_ = FSE_optimalTableLog((uint)wksp,(size_t)workspace_local,wksp._4_4_);
      pvVar2 = (void *)FSE_normalizeCount((short *)((long)workspace + 0x198),(uint)wksp,
                                          (uint *)((long)workspace + 0x164),(size_t)workspace_local,
                                          wksp._4_4_,0);
      uVar1 = ERR_isError((size_t)pvVar2);
      dst_local = pvVar2;
      if (uVar1 == 0) {
        pvVar2 = (void *)FSE_writeNCount(oend,_tableLog - (long)oend,
                                         (short *)((long)workspace + 0x198),wksp._4_4_,(uint)wksp);
        uVar1 = ERR_isError((size_t)pvVar2);
        dst_local = pvVar2;
        if (uVar1 == 0) {
          oend = (BYTE *)((long)pvVar2 + (long)oend);
          pvVar2 = (void *)FSE_buildCTable_wksp
                                     ((FSE_CTable *)workspace,(short *)((long)workspace + 0x198),
                                      wksp._4_4_,(uint)wksp,(void *)((long)workspace + 0xec),0x78);
          uVar1 = ERR_isError((size_t)pvVar2);
          dst_local = pvVar2;
          if (uVar1 == 0) {
            pvVar2 = (void *)FSE_compress_usingCTable
                                       (oend,_tableLog - (long)oend,(void *)wtSize_local,
                                        (size_t)workspace_local,(FSE_CTable *)workspace);
            uVar1 = ERR_isError((size_t)pvVar2);
            dst_local = pvVar2;
            if (uVar1 == 0) {
              if (pvVar2 == (void *)0x0) {
                dst_local = (void *)0x0;
              }
              else {
                dst_local = (BYTE *)((long)pvVar2 + (long)oend) + -(long)op;
              }
            }
          }
        }
      }
    }
  }
  return (size_t)dst_local;
}

Assistant:

static size_t HUF_compressWeights(void* dst, size_t dstSize, const void* weightTable, size_t wtSize, void* workspace, size_t workspaceSize)
{
    BYTE* const ostart = (BYTE*) dst;
    BYTE* op = ostart;
    BYTE* const oend = ostart + dstSize;

    unsigned maxSymbolValue = HUF_TABLELOG_MAX;
    U32 tableLog = MAX_FSE_TABLELOG_FOR_HUFF_HEADER;
    HUF_CompressWeightsWksp* wksp = (HUF_CompressWeightsWksp*)workspace;

    if (workspaceSize < sizeof(HUF_CompressWeightsWksp)) return ERROR(GENERIC);

    /* init conditions */
    if (wtSize <= 1) return 0;  /* Not compressible */

    /* Scan input and build symbol stats */
    {   unsigned const maxCount = HIST_count_simple(wksp->count, &maxSymbolValue, weightTable, wtSize);   /* never fails */
        if (maxCount == wtSize) return 1;   /* only a single symbol in src : rle */
        if (maxCount == 1) return 0;        /* each symbol present maximum once => not compressible */
    }

    tableLog = FSE_optimalTableLog(tableLog, wtSize, maxSymbolValue);
    CHECK_F( FSE_normalizeCount(wksp->norm, tableLog, wksp->count, wtSize, maxSymbolValue, /* useLowProbCount */ 0) );

    /* Write table description header */
    {   CHECK_V_F(hSize, FSE_writeNCount(op, (size_t)(oend-op), wksp->norm, maxSymbolValue, tableLog) );
        op += hSize;
    }

    /* Compress */
    CHECK_F( FSE_buildCTable_wksp(wksp->CTable, wksp->norm, maxSymbolValue, tableLog, wksp->scratchBuffer, sizeof(wksp->scratchBuffer)) );
    {   CHECK_V_F(cSize, FSE_compress_usingCTable(op, (size_t)(oend - op), weightTable, wtSize, wksp->CTable) );
        if (cSize == 0) return 0;   /* not enough space for compressed data */
        op += cSize;
    }

    return (size_t)(op-ostart);
}